

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int64_t GetFilSiz(GmfMshSct *msh)

{
  int iVar1;
  long lVar2;
  long in_RDI;
  int64_t EndPos;
  int64_t CurPos;
  undefined8 local_18;
  
  if ((*(uint *)(in_RDI + 0xc) & 2) == 0) {
    lVar2 = ftell(*(FILE **)(in_RDI + 0x300410));
    iVar1 = fseek(*(FILE **)(in_RDI + 0x300410),0,2);
    if (iVar1 != 0) {
      longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x22);
    }
    local_18 = ftell(*(FILE **)(in_RDI + 0x300410));
    iVar1 = fseek(*(FILE **)(in_RDI + 0x300410),lVar2,0);
    if (iVar1 != 0) {
      longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x23);
    }
  }
  else {
    lVar2 = ftell(*(FILE **)(in_RDI + 0x300410));
    iVar1 = fseek(*(FILE **)(in_RDI + 0x300410),0,2);
    if (iVar1 != 0) {
      longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x20);
    }
    local_18 = ftell(*(FILE **)(in_RDI + 0x300410));
    iVar1 = fseek(*(FILE **)(in_RDI + 0x300410),lVar2,0);
    if (iVar1 != 0) {
      longjmp((__jmp_buf_tag *)(in_RDI + 0x48),-0x21);
    }
  }
  return local_18;
}

Assistant:

static int64_t GetFilSiz(GmfMshSct *msh)
{
   int64_t CurPos, EndPos = 0;

   if(msh->typ & Bin)
   {
#ifdef WITH_GMF_AIO
      CurPos = lseek(msh->FilDes, 0, 1);
      EndPos = lseek(msh->FilDes, 0, 2);
      lseek(msh->FilDes, (size_t)CurPos, 0);
#else
      CurPos = MYFTELL(msh->hdl);

      if(MYFSEEK(msh->hdl, 0, SEEK_END) != 0)
         longjmp(msh->err, -32);

      EndPos = MYFTELL(msh->hdl);

      if(MYFSEEK(msh->hdl, (size_t)CurPos, SEEK_SET) != 0)
         longjmp(msh->err, -33);
#endif
   }
   else
   {
      CurPos = MYFTELL(msh->hdl);

      if(MYFSEEK(msh->hdl, 0, SEEK_END) != 0)
         longjmp(msh->err, -34);

      EndPos = MYFTELL(msh->hdl);

      if(MYFSEEK(msh->hdl, (size_t)CurPos, SEEK_SET) != 0)
         longjmp(msh->err, -35);
   }

   return(EndPos);
}